

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cc
# Opt level: O1

t_object * __thiscall t_queue::f_string(t_queue *this)

{
  t_queue<128UL> *ptVar1;
  long *plVar2;
  t_object *ptVar3;
  anon_class_8_1_8991fb9c local_28;
  t_shared_lock_with_safe_region<std::shared_mutex> local_20;
  
  ptVar1 = (this->super_t_sharable).super_t_owned.v_owner;
  local_28.this = this;
  plVar2 = (long *)__tls_get_addr(&PTR_0010fe08);
  if (ptVar1 == (t_queue<128UL> *)*plVar2) {
    ptVar3 = f_string::anon_class_8_1_8991fb9c::operator()(&local_28);
  }
  else {
    if (ptVar1 != (t_queue<128UL> *)0x0) {
      xemmai::f_throw(0x18,L"owned by another thread.");
    }
    xemmai::t_shared_lock_with_safe_region<std::shared_mutex>::t_shared_lock_with_safe_region
              (&local_20,&(this->super_t_sharable).v_mutex);
    if ((this->super_t_sharable).super_t_owned.v_owner != (t_queue<128UL> *)0x0) {
      xemmai::f_throw(0x18,L"owned by another thread.");
    }
    ptVar3 = f_string::anon_class_8_1_8991fb9c::operator()(&local_28);
    if (local_20.super_shared_lock<std::shared_mutex>._M_owns == true) {
      pthread_rwlock_unlock((pthread_rwlock_t *)local_20.super_shared_lock<std::shared_mutex>._M_pm)
      ;
    }
  }
  return ptVar3;
}

Assistant:

t_object* t_queue::f_string()
{
	return f_owned_or_shared<t_shared_lock_with_safe_region>([&]
	{
		std::vector<wchar_t> cs;
		if (v_head) {
			t_object* pair = v_head->f_as<t_pair>().v_next;
			while (true) {
				if (auto p = f_string_or_null(pair->f_as<t_pair>().v_value)) {
					auto& s = p->f_as<t_string>();
					cs.insert(cs.end(), static_cast<const wchar_t*>(s), s + s.f_size());
				} else {
					auto s = L"<unprintable>"sv;
					cs.insert(cs.end(), s.begin(), s.end());
				}
				cs.push_back(L'\n');
				if (pair == v_head) break;
				pair = pair->f_as<t_pair>().v_next;
			}
		}
		return t_string::f_instantiate(cs.data(), cs.size());
	});
}